

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

void vkt::tessellation::getClampedRoundedQuadTessLevels
               (SpacingMode spacingMode,float *innerSrc,float *outerSrc,int *innerDst,int *outerDst)

{
  int iVar1;
  int local_38;
  int local_34;
  int i_1;
  int i;
  int *outerDst_local;
  int *innerDst_local;
  float *outerSrc_local;
  float *innerSrc_local;
  SpacingMode spacingMode_local;
  
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    iVar1 = getClampedRoundedTessLevel(spacingMode,innerSrc[local_34]);
    innerDst[local_34] = iVar1;
  }
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    iVar1 = getClampedRoundedTessLevel(spacingMode,outerSrc[local_38]);
    outerDst[local_38] = iVar1;
  }
  return;
}

Assistant:

void getClampedRoundedQuadTessLevels (const SpacingMode spacingMode,
									  const float*		innerSrc,
									  const float*		outerSrc,
									  int*				innerDst,
									  int*				outerDst)
{
	for (int i = 0; i < 2; i++)
		innerDst[i] = getClampedRoundedTessLevel(spacingMode, innerSrc[i]);
	for (int i = 0; i < 4; i++)
		outerDst[i] = getClampedRoundedTessLevel(spacingMode, outerSrc[i]);
}